

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O2

void __thiscall spdlog::spdlog_ex::spdlog_ex(spdlog_ex *this,string *msg,int last_errno)

{
  string_view message;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *buf;
  memory_buf_t outbuf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_158;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> local_138;
  
  *(undefined ***)this = &PTR__spdlog_ex_0019ee08;
  (this->msg_)._M_dataplus._M_p = (pointer)&(this->msg_).field_2;
  (this->msg_)._M_string_length = 0;
  (this->msg_).field_2._M_local_buf[0] = '\0';
  local_138.super_buffer<char>.ptr_ = local_138.store_;
  local_138.super_buffer<char>.size_ = 0;
  local_138.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0019e2b8;
  local_138.super_buffer<char>.capacity_ = 0xfa;
  message.data_ = (msg->_M_dataplus)._M_p;
  message.size_ = msg->_M_string_length;
  fmt::v6::format_system_error(&local_138.super_buffer<char>,last_errno,message);
  fmt::v6::to_string<char,250ul>(&bStack_158,(v6 *)&local_138,buf);
  std::__cxx11::string::operator=((string *)&this->msg_,(string *)&bStack_158);
  std::__cxx11::string::~string((string *)&bStack_158);
  fmt::v6::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer(&local_138)
  ;
  return;
}

Assistant:

SPDLOG_INLINE spdlog_ex::spdlog_ex(const std::string &msg, int last_errno)
{
    memory_buf_t outbuf;
    fmt::format_system_error(outbuf, last_errno, msg);
    msg_ = fmt::to_string(outbuf);
}